

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarSimSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Ssw_Pars_t *pPars)

{
  int iVar1;
  Aig_Man_t *p0;
  Aig_Man_t *p1;
  
  p0 = Abc_NtkToDar(pNtk1,0,1);
  iVar1 = (int)pNtk1;
  if (p0 == (Aig_Man_t *)0x0) {
LAB_002730fb:
    Abc_Print(iVar1,"Converting miter into AIG has failed.\n");
    iVar1 = -1;
  }
  else {
    if (p0->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pMan1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xc74,"int Abc_NtkDarSimSec(Abc_Ntk_t *, Abc_Ntk_t *, Ssw_Pars_t *)");
    }
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      p1 = (Aig_Man_t *)0x0;
    }
    else {
      p1 = Abc_NtkToDar(pNtk2,0,1);
      iVar1 = (int)pNtk2;
      if (p1 == (Aig_Man_t *)0x0) goto LAB_002730fb;
      if (p1->nRegs < 1) {
        __assert_fail("Aig_ManRegNum(pMan2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0xc7e,"int Abc_NtkDarSimSec(Abc_Ntk_t *, Abc_Ntk_t *, Ssw_Pars_t *)");
      }
    }
    iVar1 = Ssw_SecWithSimilarity(p0,p1,pPars);
    Aig_ManStop(p0);
    if (p1 != (Aig_Man_t *)0x0) {
      Aig_ManStop(p1);
    }
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarSimSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pMan1, * pMan2 = NULL;
    int RetValue;
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return -1;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
    }

    // perform verification
    RetValue = Ssw_SecWithSimilarity( pMan1, pMan2, pPars );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return RetValue;
}